

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

bool __thiscall
roaring::Roaring64MapSetBitBiDirectionalIterator::operator==
          (Roaring64MapSetBitBiDirectionalIterator *this,Roaring64MapSetBitBiDirectionalIterator *o)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  
  p_Var1 = (this->map_iter)._M_node;
  if ((_Rb_tree_header *)p_Var1 == &(this->p->_M_t)._M_impl.super__Rb_tree_header) {
    p_Var2 = (o->map_iter)._M_node;
    if ((_Rb_tree_header *)p_Var2 == &(o->p->_M_t)._M_impl.super__Rb_tree_header) {
      return true;
    }
  }
  else {
    p_Var2 = (o->map_iter)._M_node;
  }
  if ((_Rb_tree_header *)p_Var2 != &(o->p->_M_t)._M_impl.super__Rb_tree_header) {
    return CONCAT44(p_Var1[1]._M_color,(this->i).current_value) ==
           CONCAT44(p_Var2[1]._M_color,(o->i).current_value);
  }
  return false;
}

Assistant:

bool operator==(const Roaring64MapSetBitBiDirectionalIterator &o) const {
        if (map_iter == p->cend() && o.map_iter == o.p->cend()) return true;
        if (o.map_iter == o.p->cend()) return false;
        return **this == *o;
    }